

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O2

iterator AddLogMsg(char *szPath,int ln,char *szFunc,logLevelTy lvl,char *szMsg,__va_list_tag *args)

{
  _List_node_base *p_Var1;
  bool bVar2;
  char *pcVar3;
  logLevelTy lvl_local;
  int ln_local;
  char *local_30;
  char *szFunc_local;
  char *local_20;
  
  lvl_local = lvl;
  ln_local = ln;
  szFunc_local = szFunc;
  std::recursive_mutex::lock(&gLogMutex);
  pcVar3 = strrchr(szPath,0x2f);
  local_30 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    local_30 = szPath;
  }
  if (args != (__va_list_tag *)0x0) {
    vsnprintf(gBuf,0xfd0,szMsg,args);
    szMsg = gBuf;
  }
  local_20 = szMsg;
  std::__cxx11::list<LogMsgTy,std::allocator<LogMsgTy>>::
  emplace_front<char_const*&,int&,char_const*&,logLevelTy&,char_const*>
            ((list<LogMsgTy,std::allocator<LogMsgTy>> *)&gLog_abi_cxx11_,&local_30,&ln_local,
             &szFunc_local,&lvl_local,&local_20);
  bVar2 = DataRefs::IsXPThread(&dataRefs);
  if (bVar2) {
    FlushMsg();
  }
  p_Var1 = gLog_abi_cxx11_.super__List_base<LogMsgTy,_std::allocator<LogMsgTy>_>._M_impl._M_node.
           super__List_node_base._M_next;
  pthread_mutex_unlock((pthread_mutex_t *)&gLogMutex);
  return (iterator)p_Var1;
}

Assistant:

LogMsgListTy::iterator AddLogMsg (const char* szPath, int ln, const char* szFunc,
                                  logLevelTy lvl, const char* szMsg, va_list args)
{
    // We get the lock already to avoid having to lock twice if in main thread
    std::lock_guard<std::recursive_mutex> lock(gLogMutex);
    
    // Cut off path from file name
    const char* szFile = strrchr(szPath, PATH_DELIM);  // extract file from path
    if (!szFile) szFile = szPath; else szFile++;

    // Prepare the formatted string if variable arguments are given
    if (args)
        vsnprintf(gBuf, sizeof(gBuf), szMsg, args);

    // Add the list entry
    gLog.emplace_front(szFile, ln, szFunc, lvl,
                       args ? gBuf : szMsg);

    // Flush immediately if called from main thread
    if (dataRefs.IsXPThread())
        FlushMsg();
    
    // was added to the front
    return gLog.begin();
}